

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

uchar * __thiscall
cimg_library::CImg<unsigned_char>::max_min<float>(CImg<unsigned_char> *this,float *min_val)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  bool bVar7;
  CImgInstanceException *this_00;
  char *pcVar8;
  char *pcVar9;
  ulongT uVar10;
  uchar val;
  uchar *_maxptrs;
  uchar *ptrs;
  uchar min_value;
  byte *pbStack_30;
  uchar max_value;
  uchar *ptr_max;
  float *min_val_local;
  CImg<unsigned_char> *this_local;
  
  bVar7 = is_empty(this);
  if (!bVar7) {
    pbStack_30 = this->_data;
    ptrs._6_1_ = *pbStack_30;
    _maxptrs = this->_data;
    puVar6 = this->_data;
    uVar10 = size(this);
    ptrs._7_1_ = ptrs._6_1_;
    for (; _maxptrs < puVar6 + uVar10; _maxptrs = _maxptrs + 1) {
      bVar1 = *_maxptrs;
      if (ptrs._7_1_ < bVar1) {
        pbStack_30 = _maxptrs;
        ptrs._7_1_ = bVar1;
      }
      if (bVar1 < ptrs._6_1_) {
        ptrs._6_1_ = bVar1;
      }
    }
    *min_val = (float)ptrs._6_1_;
    return pbStack_30;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
  uVar2 = this->_width;
  uVar3 = this->_height;
  uVar4 = this->_depth;
  uVar5 = this->_spectrum;
  puVar6 = this->_data;
  pcVar8 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar8 = "";
  }
  pcVar9 = pixel_type();
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min(): Empty instance.",
             (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,puVar6,pcVar8,pcVar9);
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgInstanceException::~CImgInstanceException
             );
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }